

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

bool __thiscall
cmConditionEvaluator::HandleLevel1
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *param_2,MessageType *param_3)

{
  ulong uVar1;
  pointer pcVar2;
  iterator iVar3;
  bool bVar4;
  int iVar5;
  cmConditionEvaluator *pcVar6;
  char *pcVar7;
  cmState *this_00;
  cmCommand *pcVar8;
  string *psVar9;
  cmTarget *pcVar10;
  ostream *poVar11;
  cmTest *pcVar12;
  PolicyID id;
  _Self __tmp;
  cmExpandedCommandArgument *pcVar13;
  cmMakefile *pcVar14;
  int reducible;
  iterator argP2;
  iterator arg;
  PolicyID pid;
  int local_1ec;
  iterator local_1e8;
  iterator local_1e0;
  iterator local_1d8;
  string local_1d0;
  undefined8 local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [360];
  
  do {
    local_1ec = 0;
    local_1d8._M_node =
         (newArgs->
         super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
         _M_impl._M_node.super__List_node_base._M_next;
    local_1e0._M_node = (_List_node_base *)0x0;
    if (local_1d8._M_node == (_List_node_base *)newArgs) {
      return true;
    }
    do {
      local_1e8._M_node = local_1d8._M_node;
      if ((local_1d8._M_node != (_List_node_base *)newArgs) &&
         (local_1e8._M_node = (local_1d8._M_node)->_M_next, local_1e0._M_node = local_1e8._M_node,
         local_1e8._M_node != (_List_node_base *)newArgs)) {
        local_1e0._M_node = (local_1e8._M_node)->_M_next;
      }
      pcVar13 = (cmExpandedCommandArgument *)(local_1d8._M_node + 1);
      bVar4 = IsKeyword(this,&keyEXISTS_abi_cxx11_,pcVar13);
      if ((bVar4) && (local_1e8._M_node != (_List_node_base *)newArgs)) {
        pcVar6 = (cmConditionEvaluator *)
                 cmExpandedCommandArgument::c_str
                           ((cmExpandedCommandArgument *)(local_1e8._M_node + 1));
        bVar4 = cmsys::SystemTools::FileExists((char *)pcVar6);
        HandlePredicate(pcVar6,bVar4,&local_1ec,&local_1d8,newArgs,&local_1e8,&local_1e0);
      }
      bVar4 = IsKeyword(this,&keyIS_DIRECTORY_abi_cxx11_,pcVar13);
      if ((bVar4) && (local_1e8._M_node != (_List_node_base *)newArgs)) {
        pcVar7 = cmExpandedCommandArgument::c_str
                           ((cmExpandedCommandArgument *)(local_1e8._M_node + 1));
        pcVar6 = (cmConditionEvaluator *)local_1a8;
        std::__cxx11::string::string((string *)pcVar6,pcVar7,(allocator *)&local_1d0);
        bVar4 = cmsys::SystemTools::FileIsDirectory((string *)pcVar6);
        HandlePredicate(pcVar6,bVar4,&local_1ec,&local_1d8,newArgs,&local_1e8,&local_1e0);
        if ((cmMakefile *)local_1a8._0_8_ != (cmMakefile *)local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
        }
      }
      bVar4 = IsKeyword(this,&keyIS_SYMLINK_abi_cxx11_,pcVar13);
      if ((bVar4) && (local_1e8._M_node != (_List_node_base *)newArgs)) {
        pcVar7 = cmExpandedCommandArgument::c_str
                           ((cmExpandedCommandArgument *)(local_1e8._M_node + 1));
        pcVar6 = (cmConditionEvaluator *)local_1a8;
        std::__cxx11::string::string((string *)pcVar6,pcVar7,(allocator *)&local_1d0);
        bVar4 = cmsys::SystemTools::FileIsSymlink((string *)pcVar6);
        HandlePredicate(pcVar6,bVar4,&local_1ec,&local_1d8,newArgs,&local_1e8,&local_1e0);
        if ((cmMakefile *)local_1a8._0_8_ != (cmMakefile *)local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
        }
      }
      bVar4 = IsKeyword(this,&keyIS_ABSOLUTE_abi_cxx11_,pcVar13);
      if ((bVar4) && (local_1e8._M_node != (_List_node_base *)newArgs)) {
        pcVar6 = (cmConditionEvaluator *)
                 cmExpandedCommandArgument::c_str
                           ((cmExpandedCommandArgument *)(local_1e8._M_node + 1));
        bVar4 = cmsys::SystemTools::FileIsFullPath((char *)pcVar6);
        HandlePredicate(pcVar6,bVar4,&local_1ec,&local_1d8,newArgs,&local_1e8,&local_1e0);
      }
      bVar4 = IsKeyword(this,&keyCOMMAND_abi_cxx11_,pcVar13);
      iVar3._M_node = local_1e8._M_node;
      if ((bVar4) && (local_1e8._M_node != (_List_node_base *)newArgs)) {
        this_00 = cmMakefile::GetState(this->Makefile);
        pcVar7 = cmExpandedCommandArgument::c_str((cmExpandedCommandArgument *)(iVar3._M_node + 1));
        std::__cxx11::string::string((string *)local_1a8,pcVar7,(allocator *)&local_1d0);
        pcVar8 = cmState::GetCommand(this_00,(string *)local_1a8);
        pcVar14 = (cmMakefile *)local_1a8._0_8_;
        if ((cmMakefile *)local_1a8._0_8_ != (cmMakefile *)local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
        }
        HandlePredicate((cmConditionEvaluator *)pcVar14,pcVar8 != (cmCommand *)0x0,&local_1ec,
                        &local_1d8,newArgs,&local_1e8,&local_1e0);
      }
      bVar4 = IsKeyword(this,&keyPOLICY_abi_cxx11_,pcVar13);
      if ((bVar4) && (local_1e8._M_node != (_List_node_base *)newArgs)) {
        pcVar6 = (cmConditionEvaluator *)
                 cmExpandedCommandArgument::c_str
                           ((cmExpandedCommandArgument *)(local_1e8._M_node + 1));
        bVar4 = cmPolicies::GetPolicyID((char *)pcVar6,(PolicyID *)local_1a8);
        HandlePredicate(pcVar6,bVar4,&local_1ec,&local_1d8,newArgs,&local_1e8,&local_1e0);
      }
      bVar4 = IsKeyword(this,&keyTARGET_abi_cxx11_,pcVar13);
      if ((bVar4) && (local_1e8._M_node != (_List_node_base *)newArgs)) {
        pcVar14 = this->Makefile;
        psVar9 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                           ((cmExpandedCommandArgument *)(local_1e8._M_node + 1));
        pcVar10 = cmMakefile::FindTargetToUse(pcVar14,psVar9,false);
        HandlePredicate((cmConditionEvaluator *)pcVar14,pcVar10 != (cmTarget *)0x0,&local_1ec,
                        &local_1d8,newArgs,&local_1e8,&local_1e0);
      }
      if (this->Policy64Status < NEW) {
        if ((this->Policy64Status == WARN) &&
           (bVar4 = IsKeyword(this,&keyTEST_abi_cxx11_,pcVar13), bVar4)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1d0,(cmPolicies *)0x40,id);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,
                               local_1d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "TEST will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                     ,0x82);
          pcVar14 = this->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar14,AUTHOR_WARNING,&local_1d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_198 + 0x60));
        }
      }
      else {
        bVar4 = IsKeyword(this,&keyTEST_abi_cxx11_,pcVar13);
        if ((bVar4) && (local_1e8._M_node != (_List_node_base *)newArgs)) {
          pcVar14 = this->Makefile;
          pcVar7 = cmExpandedCommandArgument::c_str
                             ((cmExpandedCommandArgument *)(local_1e8._M_node + 1));
          std::__cxx11::string::string((string *)local_1a8,pcVar7,(allocator *)&local_1d0);
          pcVar12 = cmMakefile::GetTest(pcVar14,(string *)local_1a8);
          pcVar14 = (cmMakefile *)local_1a8._0_8_;
          if ((cmMakefile *)local_1a8._0_8_ != (cmMakefile *)local_198) {
            operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
          }
          HandlePredicate((cmConditionEvaluator *)pcVar14,pcVar12 != (cmTest *)0x0,&local_1ec,
                          &local_1d8,newArgs,&local_1e8,&local_1e0);
        }
      }
      iVar3._M_node = local_1d8._M_node;
      bVar4 = IsKeyword(this,&keyDEFINED_abi_cxx11_,
                        (cmExpandedCommandArgument *)(local_1d8._M_node + 1));
      if ((bVar4) && (local_1e8._M_node != (_List_node_base *)newArgs)) {
        pcVar13 = (cmExpandedCommandArgument *)(local_1e8._M_node + 1);
        psVar9 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar13);
        uVar1 = psVar9->_M_string_length;
        if (uVar1 < 5) {
LAB_00418518:
          pcVar14 = this->Makefile;
          psVar9 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar13);
          bVar4 = cmMakefile::IsDefinitionSet(pcVar14,psVar9);
        }
        else {
          psVar9 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar13);
          local_1b0 = 0;
          std::__cxx11::string::substr((ulong)local_1a8,(ulong)psVar9);
          iVar5 = std::__cxx11::string::compare(local_1a8);
          if (iVar5 == 0) {
            psVar9 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar13);
            pcVar2 = (psVar9->_M_dataplus)._M_p;
            local_1b0 = CONCAT71((int7)((ulong)pcVar2 >> 8),pcVar2[uVar1 - 1] == '}');
          }
          if ((cmMakefile *)local_1a8._0_8_ != (cmMakefile *)local_198) {
            operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
          }
          if ((char)local_1b0 == '\0') goto LAB_00418518;
          psVar9 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar13);
          std::__cxx11::string::substr((ulong)local_1a8,(ulong)psVar9);
          bVar4 = cmsys::SystemTools::HasEnv((char *)local_1a8._0_8_);
          pcVar14 = (cmMakefile *)local_1a8._0_8_;
          if ((cmMakefile *)local_1a8._0_8_ != (cmMakefile *)local_198) {
            operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
          }
        }
        HandlePredicate((cmConditionEvaluator *)pcVar14,bVar4,&local_1ec,&local_1d8,newArgs,
                        &local_1e8,&local_1e0);
      }
      local_1d8._M_node =
           (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
            &(iVar3._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (local_1d8._M_node != (_List_node_base *)newArgs);
    if (local_1ec == 0) {
      return true;
    }
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel1(cmArgumentList& newArgs, std::string&,
                                        cmake::MessageType&)
{
  int reducible;
  do {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end()) {
      argP1 = arg;
      this->IncrementArguments(newArgs, argP1, argP2);
      // does a file exist
      if (this->IsKeyword(keyEXISTS, *arg) && argP1 != newArgs.end()) {
        this->HandlePredicate(cmSystemTools::FileExists(argP1->c_str()),
                              reducible, arg, newArgs, argP1, argP2);
      }
      // does a directory with this name exist
      if (this->IsKeyword(keyIS_DIRECTORY, *arg) && argP1 != newArgs.end()) {
        this->HandlePredicate(cmSystemTools::FileIsDirectory(argP1->c_str()),
                              reducible, arg, newArgs, argP1, argP2);
      }
      // does a symlink with this name exist
      if (this->IsKeyword(keyIS_SYMLINK, *arg) && argP1 != newArgs.end()) {
        this->HandlePredicate(cmSystemTools::FileIsSymlink(argP1->c_str()),
                              reducible, arg, newArgs, argP1, argP2);
      }
      // is the given path an absolute path ?
      if (this->IsKeyword(keyIS_ABSOLUTE, *arg) && argP1 != newArgs.end()) {
        this->HandlePredicate(cmSystemTools::FileIsFullPath(argP1->c_str()),
                              reducible, arg, newArgs, argP1, argP2);
      }
      // does a command exist
      if (this->IsKeyword(keyCOMMAND, *arg) && argP1 != newArgs.end()) {
        cmCommand* command =
          this->Makefile.GetState()->GetCommand(argP1->c_str());
        this->HandlePredicate(command != CM_NULLPTR, reducible, arg, newArgs,
                              argP1, argP2);
      }
      // does a policy exist
      if (this->IsKeyword(keyPOLICY, *arg) && argP1 != newArgs.end()) {
        cmPolicies::PolicyID pid;
        this->HandlePredicate(cmPolicies::GetPolicyID(argP1->c_str(), pid),
                              reducible, arg, newArgs, argP1, argP2);
      }
      // does a target exist
      if (this->IsKeyword(keyTARGET, *arg) && argP1 != newArgs.end()) {
        this->HandlePredicate(
          this->Makefile.FindTargetToUse(argP1->GetValue()) != CM_NULLPTR,
          reducible, arg, newArgs, argP1, argP2);
      }
      // does a test exist
      if (this->Policy64Status != cmPolicies::OLD &&
          this->Policy64Status != cmPolicies::WARN) {
        if (this->IsKeyword(keyTEST, *arg) && argP1 != newArgs.end()) {
          const cmTest* haveTest = this->Makefile.GetTest(argP1->c_str());
          this->HandlePredicate(haveTest != CM_NULLPTR, reducible, arg,
                                newArgs, argP1, argP2);
        }
      } else if (this->Policy64Status == cmPolicies::WARN &&
                 this->IsKeyword(keyTEST, *arg)) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0064) << "\n";
        e << "TEST will be interpreted as an operator "
             "when the policy is set to NEW.  "
             "Since the policy is not set the OLD behavior will be used.";

        this->Makefile.IssueMessage(cmake::AUTHOR_WARNING, e.str());
      }
      // is a variable defined
      if (this->IsKeyword(keyDEFINED, *arg) && argP1 != newArgs.end()) {
        size_t argP1len = argP1->GetValue().size();
        bool bdef = false;
        if (argP1len > 4 && argP1->GetValue().substr(0, 4) == "ENV{" &&
            argP1->GetValue().operator[](argP1len - 1) == '}') {
          std::string env = argP1->GetValue().substr(4, argP1len - 5);
          bdef = cmSystemTools::HasEnv(env.c_str());
        } else {
          bdef = this->Makefile.IsDefinitionSet(argP1->GetValue());
        }
        this->HandlePredicate(bdef, reducible, arg, newArgs, argP1, argP2);
      }
      ++arg;
    }
  } while (reducible);
  return true;
}